

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_equal_bvec4(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar1 = c->in[0].m_data[0];
  fVar2 = c->in[0].m_data[2];
  fVar3 = c->in[0].m_data[3];
  fVar4 = c->in[1].m_data[0];
  fVar5 = c->in[1].m_data[1];
  fVar6 = c->in[1].m_data[2];
  (c->color).m_data[0] =
       (float)(-(uint)(c->in[1].m_data[3] <= 0.0 != 0.0 < c->in[0].m_data[1]) & 0x3f800000);
  (c->color).m_data[1] = (float)(-(uint)(fVar6 <= 0.0 != 0.0 < fVar2) & 0x3f800000);
  (c->color).m_data[2] = (float)(-(uint)(fVar5 <= 0.0 != 0.0 < fVar3) & 0x3f800000);
  (c->color).m_data[3] = (float)(-(uint)(fVar4 <= 0.0 != 0.0 < fVar1) & 0x3f800000);
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }